

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O0

DUMB_CLICK * dumb_click_mergesort(DUMB_CLICK *click,int n_clicks)

{
  DUMB_CLICK *pDVar1;
  int in_ESI;
  DUMB_CLICK *in_RDI;
  DUMB_CLICK **cp;
  DUMB_CLICK *c2;
  DUMB_CLICK *c1;
  int i;
  undefined8 *local_30;
  DUMB_CLICK *local_28;
  int iVar2;
  DUMB_CLICK *local_10;
  DUMB_CLICK *local_8;
  
  local_8 = in_RDI;
  if (1 < in_ESI) {
    local_30 = (undefined8 *)&stack0xffffffffffffffe0;
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 2) {
      local_30 = (undefined8 *)*local_30;
    }
    local_10 = in_RDI;
    *local_30 = 0;
    pDVar1 = dumb_click_mergesort((DUMB_CLICK *)CONCAT44(in_ESI,iVar2),(int)((ulong)in_RDI >> 0x20))
    ;
    local_28 = dumb_click_mergesort
                         ((DUMB_CLICK *)CONCAT44(in_ESI,iVar2),(int)((ulong)pDVar1 >> 0x20));
    local_30 = &local_10;
    while (pDVar1 != (DUMB_CLICK *)0x0 && local_28 != (DUMB_CLICK *)0x0) {
      if (local_28->pos < pDVar1->pos) {
        *local_30 = local_28;
        local_28 = local_28->next;
      }
      else {
        *local_30 = pDVar1;
        pDVar1 = pDVar1->next;
      }
      local_30 = (undefined8 *)*local_30;
    }
    if (local_28 == (DUMB_CLICK *)0x0) {
      *local_30 = pDVar1;
    }
    else {
      *local_30 = local_28;
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

static DUMB_CLICK *dumb_click_mergesort(DUMB_CLICK *click, int n_clicks)
{
	int i;
	DUMB_CLICK *c1, *c2, **cp;

	if (n_clicks <= 1) return click;

	/* Split the list into two */
	c1 = click;
	cp = &c1;
	for (i = 0; i < n_clicks; i += 2) cp = &(*cp)->next;
	c2 = *cp;
	*cp = NULL;

	/* Sort the sublists */
	c1 = dumb_click_mergesort(c1, (n_clicks + 1) >> 1);
	c2 = dumb_click_mergesort(c2, n_clicks >> 1);

	/* Merge them */
	cp = &click;
	while (c1 && c2) {
		if (c1->pos > c2->pos) {
			*cp = c2;
			c2 = c2->next;
		} else {
			*cp = c1;
			c1 = c1->next;
		}
		cp = &(*cp)->next;
	}
	if (c2)
		*cp = c2;
	else
		*cp = c1;

	return click;
}